

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.c
# Opt level: O0

int32 bio_fread_1d(void **buf,size_t el_sz,uint32 *n_el,FILE *fp,int32 sw,uint32 *ck)

{
  int32 iVar1;
  uint32 uVar2;
  void *pvVar3;
  uint32 *ck_local;
  int32 sw_local;
  FILE *fp_local;
  uint32 *n_el_local;
  size_t el_sz_local;
  void **buf_local;
  
  iVar1 = bio_fread(n_el,4,1,fp,sw,ck);
  if (iVar1 != 1) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/bio.c"
            ,0x172,"fread(arraysize) failed\n");
    exit(1);
  }
  if (*n_el == 0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/bio.c"
            ,0x174,"Bad arraysize: %d\n",(ulong)*n_el);
    exit(1);
  }
  pvVar3 = __ckd_calloc__((ulong)*n_el,el_sz,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/bio.c"
                          ,0x177);
  *buf = pvVar3;
  uVar2 = bio_fread(*buf,(int32)el_sz,*n_el,fp,sw,ck);
  if (uVar2 != *n_el) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/bio.c"
            ,0x17b,"fread(arraydata) failed\n");
    exit(1);
  }
  return *n_el;
}

Assistant:

int32
bio_fread_1d(void **buf, size_t el_sz, uint32 * n_el, FILE * fp,
             int32 sw, uint32 * ck)
{
    /* Read 1-d array size */
    if (bio_fread(n_el, sizeof(int32), 1, fp, sw, ck) != 1)
        E_FATAL("fread(arraysize) failed\n");
    if (*n_el <= 0)
        E_FATAL("Bad arraysize: %d\n", *n_el);

    /* Allocate memory for array data */
    *buf = (void *) ckd_calloc(*n_el, el_sz);

    /* Read array data */
    if (bio_fread(*buf, el_sz, *n_el, fp, sw, ck) != (int32)*n_el)
        E_FATAL("fread(arraydata) failed\n");

    return *n_el;
}